

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void expand_suite::expand_empty(void)

{
  size_type local_78;
  undefined4 local_6c;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_78 = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad3,"void expand_suite::expand_empty()",&local_78,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&span,1);
  local_78 = span.member.size;
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad5,"void expand_suite::expand_empty()",&local_78,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::expand_front(&span,1);
  local_78 = span.member.size;
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xad7,"void expand_suite::expand_empty()",&local_78,&local_6c);
  return;
}

Assistant:

void expand_empty()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span.expand_back(1);
    BOOST_TEST_EQ(span.size(), 1);
    span.expand_front(1);
    BOOST_TEST_EQ(span.size(), 2);
}